

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O1

int32 rw::xbox::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = *(int **)((long)object + 0x98);
  iVar2 = 0;
  if ((piVar1 != (int *)0x0) && (iVar2 = 0, *piVar1 == 5)) {
    iVar2 = piVar1[1] + piVar1[4] * piVar1[5] + 0x10;
  }
  return iVar2;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_XBOX)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	return 12 + 4 + header->size + header->stride*header->numVertices;
}